

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_rsa_decode_md_type(psa_algorithm_t alg,size_t hash_length,mbedtls_md_type_t *md_alg)

{
  byte bVar1;
  mbedtls_md_type_t mVar2;
  mbedtls_md_info_t *md_info;
  psa_algorithm_t alg_00;
  uint uVar3;
  psa_status_t pVar4;
  
  uVar3 = alg & 0xffffff00;
  if (((uVar3 | 0x10000) == 0x10030000) || ((alg & 0xfffeff00 | 0x20000) == 0x10060000)) {
    alg_00 = (alg & 0xff) + 0x1000000;
    if ((alg & 0xff) == 0) {
      alg_00 = 0;
    }
  }
  else {
    alg_00 = 0;
  }
  md_info = mbedtls_md_info_from_psa(alg_00);
  mVar2 = mbedtls_md_get_type(md_info);
  *md_alg = mVar2;
  if (hash_length >> 0x20 != 0) {
    return -0x87;
  }
  if (alg != 0x10020000 && uVar3 == 0x10020000) {
    if (md_info == (mbedtls_md_info_t *)0x0) {
      return -0x86;
    }
    bVar1 = mbedtls_md_get_size(md_info);
    if (bVar1 != hash_length) {
      return -0x87;
    }
  }
  pVar4 = -0x86;
  if (md_info != (mbedtls_md_info_t *)0x0) {
    pVar4 = 0;
  }
  if (uVar3 != 0x10030000) {
    pVar4 = 0;
  }
  return pVar4;
}

Assistant:

static psa_status_t psa_rsa_decode_md_type( psa_algorithm_t alg,
                                            size_t hash_length,
                                            mbedtls_md_type_t *md_alg )
{
    psa_algorithm_t hash_alg = PSA_ALG_SIGN_GET_HASH( alg );
    const mbedtls_md_info_t *md_info = mbedtls_md_info_from_psa( hash_alg );
    *md_alg = mbedtls_md_get_type( md_info );

    /* The Mbed TLS RSA module uses an unsigned int for hash length
     * parameters. Validate that it fits so that we don't risk an
     * overflow later. */
#if SIZE_MAX > UINT_MAX
    if( hash_length > UINT_MAX )
        return( PSA_ERROR_INVALID_ARGUMENT );
#endif

#if defined(MBEDTLS_PKCS1_V15)
    /* For PKCS#1 v1.5 signature, if using a hash, the hash length
     * must be correct. */
    if( PSA_ALG_IS_RSA_PKCS1V15_SIGN( alg ) &&
        alg != PSA_ALG_RSA_PKCS1V15_SIGN_RAW )
    {
        if( md_info == NULL )
            return( PSA_ERROR_NOT_SUPPORTED );
        if( mbedtls_md_get_size( md_info ) != hash_length )
            return( PSA_ERROR_INVALID_ARGUMENT );
    }
#endif /* MBEDTLS_PKCS1_V15 */

#if defined(MBEDTLS_PKCS1_V21)
    /* PSS requires a hash internally. */
    if( PSA_ALG_IS_RSA_PSS( alg ) )
    {
        if( md_info == NULL )
            return( PSA_ERROR_NOT_SUPPORTED );
    }
#endif /* MBEDTLS_PKCS1_V21 */

    return( PSA_SUCCESS );
}